

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumpfile.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_13::WriteBatchItemPrinter::~WriteBatchItemPrinter(WriteBatchItemPrinter *this)

{
  void *in_RDI;
  
  ~WriteBatchItemPrinter((WriteBatchItemPrinter *)0x107078);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

void Put(const Slice& key, const Slice& value) override {
    std::string r = "  put '";
    AppendEscapedStringTo(&r, key);
    r += "' '";
    AppendEscapedStringTo(&r, value);
    r += "'\n";
    dst_->Append(r);
  }